

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

size_t BuildAndStoreLiteralPrefixCode
                 (MemoryManager *m,uint8_t *input,size_t input_size,uint8_t *depths,uint16_t *bits,
                 size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  uint local_470;
  uint local_46c;
  long local_468;
  size_t literal_ratio;
  uint32_t adjust_1;
  uint32_t adjust;
  size_t i;
  size_t histogram_total;
  uint32_t histogram [256];
  size_t *storage_ix_local;
  uint16_t *bits_local;
  uint8_t *depths_local;
  size_t input_size_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  
  histogram._1016_8_ = storage_ix;
  memset(&histogram_total,0,0x400);
  if (input_size < 0x8000) {
    for (_adjust_1 = 0; _adjust_1 < input_size; _adjust_1 = _adjust_1 + 1) {
      histogram[(ulong)input[_adjust_1] - 2] = histogram[(ulong)input[_adjust_1] - 2] + 1;
    }
    i = input_size;
    for (_adjust_1 = 0; _adjust_1 < 0x100; _adjust_1 = _adjust_1 + 1) {
      local_46c = histogram[_adjust_1 - 2];
      if (10 < local_46c) {
        local_46c = 0xb;
      }
      histogram[_adjust_1 - 2] = local_46c * 2 + histogram[_adjust_1 - 2];
      i = local_46c * 2 + i;
    }
  }
  else {
    for (_adjust_1 = 0; _adjust_1 < input_size; _adjust_1 = _adjust_1 + 0x1d) {
      histogram[(ulong)input[_adjust_1] - 2] = histogram[(ulong)input[_adjust_1] - 2] + 1;
    }
    i = (input_size + 0x1c) / 0x1d;
    for (_adjust_1 = 0; _adjust_1 < 0x100; _adjust_1 = _adjust_1 + 1) {
      local_470 = histogram[_adjust_1 - 2];
      if (10 < local_470) {
        local_470 = 0xb;
      }
      uVar1 = local_470 * 2 + 1;
      histogram[_adjust_1 - 2] = uVar1 + histogram[_adjust_1 - 2];
      i = uVar1 + i;
    }
  }
  BrotliBuildAndStoreHuffmanTreeFast
            (m,(uint32_t *)&histogram_total,i,8,depths,bits,(size_t *)histogram._1016_8_,storage);
  local_468 = 0;
  for (_adjust_1 = 0; _adjust_1 < 0x100; _adjust_1 = _adjust_1 + 1) {
    if (histogram[_adjust_1 - 2] != 0) {
      local_468 = (ulong)(histogram[_adjust_1 - 2] * (uint)depths[_adjust_1]) + local_468;
    }
  }
  return (ulong)(local_468 * 0x7d) / i;
}

Assistant:

static size_t BuildAndStoreLiteralPrefixCode(MemoryManager* m,
                                             const uint8_t* input,
                                             const size_t input_size,
                                             uint8_t depths[256],
                                             uint16_t bits[256],
                                             size_t* storage_ix,
                                             uint8_t* storage) {
  uint32_t histogram[256] = { 0 };
  size_t histogram_total;
  size_t i;
  if (input_size < (1 << 15)) {
    for (i = 0; i < input_size; ++i) {
      ++histogram[input[i]];
    }
    histogram_total = input_size;
    for (i = 0; i < 256; ++i) {
      /* We weigh the first 11 samples with weight 3 to account for the
         balancing effect of the LZ77 phase on the histogram. */
      const uint32_t adjust = 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  } else {
    static const size_t kSampleRate = 29;
    for (i = 0; i < input_size; i += kSampleRate) {
      ++histogram[input[i]];
    }
    histogram_total = (input_size + kSampleRate - 1) / kSampleRate;
    for (i = 0; i < 256; ++i) {
      /* We add 1 to each population count to avoid 0 bit depths (since this is
         only a sample and we don't know if the symbol appears or not), and we
         weigh the first 11 samples with weight 3 to account for the balancing
         effect of the LZ77 phase on the histogram (more frequent symbols are
         more likely to be in backward references instead as literals). */
      const uint32_t adjust = 1 + 2 * BROTLI_MIN(uint32_t, histogram[i], 11u);
      histogram[i] += adjust;
      histogram_total += adjust;
    }
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, histogram, histogram_total,
                                     /* max_bits = */ 8,
                                     depths, bits, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return 0;
  {
    size_t literal_ratio = 0;
    for (i = 0; i < 256; ++i) {
      if (histogram[i]) literal_ratio += histogram[i] * depths[i];
    }
    /* Estimated encoding ratio, millibytes per symbol. */
    return (literal_ratio * 125) / histogram_total;
  }
}